

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O3

void mpiabi_mprobe_(MPIABI_Fint *source,MPIABI_Fint *tag,MPIABI_Fint *comm,MPIABI_Fint *message,
                   MPIABI_Fint *status,MPIABI_Fint *ierror)

{
  mpi_mprobe_();
  return;
}

Assistant:

void mpiabi_mprobe_(
  const MPIABI_Fint * source,
  const MPIABI_Fint * tag,
  const MPIABI_Fint * comm,
  MPIABI_Fint * message,
  MPIABI_Fint * status,
  MPIABI_Fint * ierror
) {
  return mpi_mprobe_(
    source,
    tag,
    comm,
    message,
    status,
    ierror
  );
}